

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

uint read_buf(z_streamp strm,Bytef *buf,uint size)

{
  uLong uVar1;
  uint local_28;
  uint len;
  uint size_local;
  Bytef *buf_local;
  z_streamp strm_local;
  
  local_28 = strm->avail_in;
  if (size < local_28) {
    local_28 = size;
  }
  if (local_28 == 0) {
    strm_local._4_4_ = 0;
  }
  else {
    strm->avail_in = strm->avail_in - local_28;
    memcpy(buf,strm->next_in,(ulong)local_28);
    if (strm->state->wrap == 1) {
      uVar1 = cm_zlib_adler32(strm->adler,buf,local_28);
      strm->adler = uVar1;
    }
    else if (strm->state->wrap == 2) {
      uVar1 = cm_zlib_z_crc32(strm->adler,buf,local_28);
      strm->adler = uVar1;
    }
    strm->next_in = strm->next_in + local_28;
    strm->total_in = (ulong)local_28 + strm->total_in;
    strm_local._4_4_ = local_28;
  }
  return strm_local._4_4_;
}

Assistant:

local unsigned read_buf(strm, buf, size)
    z_streamp strm;
    Bytef *buf;
    unsigned size;
{
    unsigned len = strm->avail_in;

    if (len > size) len = size;
    if (len == 0) return 0;

    strm->avail_in  -= len;

    zmemcpy(buf, strm->next_in, len);
    if (strm->state->wrap == 1) {
        strm->adler = adler32(strm->adler, buf, len);
    }
#ifdef GZIP
    else if (strm->state->wrap == 2) {
        strm->adler = crc32(strm->adler, buf, len);
    }
#endif
    strm->next_in  += len;
    strm->total_in += len;

    return len;
}